

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::AddRequiredTargetCFeature(cmMakefile *this,cmTarget *target,string *feature)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  char **ppcVar6;
  bool bVar7;
  byte local_40b;
  byte local_40a;
  byte local_409;
  char **local_3f8;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  byte local_2c9;
  cmStrCmp local_2c8;
  byte local_2a1;
  cmStrCmp local_2a0;
  byte local_279;
  cmStrCmp local_278;
  byte local_254;
  byte local_253;
  byte local_252;
  byte local_251;
  undefined1 local_250 [4];
  bool setC11;
  bool setC99;
  bool setC90;
  char **local_230;
  char **existingCIt;
  ostringstream local_208 [8];
  ostringstream e;
  cmStrCmp local_90;
  allocator local_59;
  string local_58;
  char *local_38;
  char *existingCStandard;
  bool needC11;
  bool needC99;
  string *psStack_28;
  bool needC90;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  existingCStandard._7_1_ = 0;
  existingCStandard._6_1_ = 0;
  existingCStandard._5_1_ = 0;
  psStack_28 = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  CheckNeededCLanguage
            (this,feature,(bool *)((long)&existingCStandard + 7),
             (bool *)((long)&existingCStandard + 6),(bool *)((long)&existingCStandard + 5));
  psVar5 = feature_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"C_STANDARD",&local_59);
  pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&C_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
    cmStrCmp::cmStrCmp(&local_90,local_38);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_90);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
    cmStrCmp::~cmStrCmp(&local_90);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_208);
      poVar4 = std::operator<<((ostream *)local_208,"The C_STANDARD property on target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
      poVar4 = std::operator<<(poVar4,local_38);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,(string *)&existingCIt,false);
      std::__cxx11::string::~string((string *)&existingCIt);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_208);
      goto LAB_00635560;
    }
  }
  local_251 = 0;
  if (local_38 == (char *)0x0) {
    local_3f8 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
  }
  else {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&C_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
    cmStrCmp::cmStrCmp((cmStrCmp *)local_250,local_38);
    local_251 = 1;
    local_3f8 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,(cmStrCmp *)local_250);
  }
  if ((local_251 & 1) != 0) {
    cmStrCmp::~cmStrCmp((cmStrCmp *)local_250);
  }
  local_230 = local_3f8;
  local_409 = 0;
  if ((existingCStandard._7_1_ & 1) != 0) {
    local_409 = local_38 != (char *)0x0 ^ 0xff;
  }
  local_252 = local_409 & 1;
  local_40a = 0;
  if ((existingCStandard._6_1_ & 1) != 0) {
    local_40a = local_38 != (char *)0x0 ^ 0xff;
  }
  local_253 = local_40a & 1;
  local_40b = 0;
  if ((existingCStandard._5_1_ & 1) != 0) {
    local_40b = local_38 != (char *)0x0 ^ 0xff;
  }
  local_254 = local_40b & 1;
  local_279 = 0;
  bVar7 = false;
  if (((existingCStandard._5_1_ & 1) != 0) && (bVar7 = false, local_38 != (char *)0x0)) {
    ppcVar2 = cmArrayBegin<char_const*,3ul>(&C_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
    cmStrCmp::cmStrCmp(&local_278,"11");
    local_279 = 1;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_278);
    bVar7 = local_3f8 < ppcVar2;
  }
  if ((local_279 & 1) != 0) {
    cmStrCmp::~cmStrCmp(&local_278);
  }
  ppcVar2 = local_230;
  if (bVar7) {
    local_254 = 1;
  }
  else {
    local_2a1 = 0;
    bVar7 = false;
    if (((existingCStandard._6_1_ & 1) != 0) && (bVar7 = false, local_38 != (char *)0x0)) {
      ppcVar3 = cmArrayBegin<char_const*,3ul>(&C_STANDARDS);
      ppcVar6 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
      cmStrCmp::cmStrCmp(&local_2a0,"99");
      local_2a1 = 1;
      ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_2a0);
      bVar7 = ppcVar2 < ppcVar3;
    }
    if ((local_2a1 & 1) != 0) {
      cmStrCmp::~cmStrCmp(&local_2a0);
    }
    ppcVar2 = local_230;
    if (bVar7) {
      local_253 = 1;
    }
    else {
      local_2c9 = 0;
      bVar7 = false;
      if (((existingCStandard._7_1_ & 1) != 0) && (bVar7 = false, local_38 != (char *)0x0)) {
        ppcVar3 = cmArrayBegin<char_const*,3ul>(&C_STANDARDS);
        ppcVar6 = cmArrayEnd<char_const*,3ul>(&C_STANDARDS);
        cmStrCmp::cmStrCmp(&local_2c8,"90");
        local_2c9 = 1;
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_2c8);
        bVar7 = ppcVar2 < ppcVar3;
      }
      if ((local_2c9 & 1) != 0) {
        cmStrCmp::~cmStrCmp(&local_2c8);
      }
      if (bVar7) {
        local_252 = 1;
      }
    }
  }
  psVar5 = feature_local;
  if ((local_254 & 1) == 0) {
    if ((local_253 & 1) == 0) {
      if ((local_252 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_340,"C_STANDARD",&local_341);
        cmTarget::SetProperty((cmTarget *)psVar5,&local_340,"90");
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator((allocator<char> *)&local_341);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_318,"C_STANDARD",&local_319);
      cmTarget::SetProperty((cmTarget *)psVar5,&local_318,"99");
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"C_STANDARD",&local_2f1);
    cmTarget::SetProperty((cmTarget *)psVar5,&local_2f0,"11");
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  }
  this_local._7_1_ = 1;
LAB_00635560:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::
AddRequiredTargetCFeature(cmTarget *target, const std::string& feature) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char *existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard)
    {
    if (std::find_if(cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS),
                  cmStrCmp(existingCStandard)) == cmArrayEnd(C_STANDARDS))
      {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  const char * const *existingCIt = existingCStandard
                                    ? std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp(existingCStandard))
                                    : cmArrayEnd(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("11")))
    {
    setC11 = true;
    }
  else if(needC99 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("99")))
    {
    setC99 = true;
    }
  else if(needC90 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("90")))
    {
    setC90 = true;
    }

  if (setC11)
    {
    target->SetProperty("C_STANDARD", "11");
    }
  else if (setC99)
    {
    target->SetProperty("C_STANDARD", "99");
    }
  else if (setC90)
    {
    target->SetProperty("C_STANDARD", "90");
    }
  return true;
}